

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QThreadData::~QThreadData(QThreadData *this)

{
  Type pvVar1;
  Type pvVar2;
  QPostEventList *this_00;
  QThreadData *in_RDI;
  QThread *t;
  Type in_stack_ffffffffffffffc8;
  QBasicAtomicPointer<QThread> *in_stack_ffffffffffffffd0;
  
  pvVar1 = QBasicAtomicPointer<void>::loadAcquire((QBasicAtomicPointer<void> *)0x555c90);
  pvVar2 = QBasicAtomicPointer<void>::loadAcquire((QBasicAtomicPointer<void> *)0x555ca1);
  if (pvVar1 == pvVar2) {
    QBasicAtomicPointer<QThread>::storeRelease(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    QBasicAtomicPointer<void>::storeRelaxed
              ((QBasicAtomicPointer<void> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    clearCurrentThreadData();
  }
  this_00 = (QPostEventList *)
            QBasicAtomicPointer<QThread>::loadAcquire((QBasicAtomicPointer<QThread> *)0x555ceb);
  QBasicAtomicPointer<QThread>::storeRelease(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (this_00 != (QPostEventList *)0x0) {
    (**(_func_int **)&(this_00->super_QList<QPostEvent>).d.d[2].super_QArrayData)();
  }
  clearEvents(in_RDI);
  QList<void_*>::~QList((QList<void_*> *)0x555d37);
  QPostEventList::~QPostEventList(this_00);
  QStack<QEventLoop_*>::~QStack((QStack<QEventLoop_*> *)0x555d4f);
  return;
}

Assistant:

QThreadData::~QThreadData()
{
#if QT_CONFIG(thread)
    Q_ASSERT(_ref.loadRelaxed() == 0);
#endif

    if (threadId.loadAcquire() == QCoreApplicationPrivate::theMainThreadId.loadAcquire()) {
        QCoreApplicationPrivate::theMainThread.storeRelease(nullptr);
        QCoreApplicationPrivate::theMainThreadId.storeRelaxed(nullptr);
        QThreadData::clearCurrentThreadData();
    }

    // ~QThread() sets thread to nullptr, so if it isn't null here, it's
    // because we're being run before the main object itself. This can only
    // happen for QAdoptedThread. Note that both ~QThreadPrivate() and
    // ~QObjectPrivate() will deref this object again, but that is acceptable
    // because this destructor is still running (the _ref sub-object has not
    // been destroyed) and there's no reentrancy. The refcount will become
    // negative, but that's acceptable.
    QThread *t = thread.loadAcquire();
    thread.storeRelease(nullptr);
    delete t;

    clearEvents();

    // fprintf(stderr, "QThreadData %p destroyed\n", this);
}